

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O0

REF_STATUS
ref_inflate_read_usm3d_mapbc
          (REF_DICT faceids,char *mapbc_file_name,char *family_name,REF_INT boundary_condition)

{
  int iVar1;
  size_t __n;
  FILE *__stream;
  char *pcVar2;
  REF_STATUS ref_private_macro_code_rss;
  size_t len;
  undefined1 local_848 [4];
  REF_INT i1;
  REF_INT i0;
  REF_INT bc_family;
  REF_INT bc;
  REF_INT faceid;
  char family [1024];
  char line [1024];
  FILE *file;
  REF_INT boundary_condition_local;
  char *family_name_local;
  char *mapbc_file_name_local;
  REF_DICT faceids_local;
  
  __n = strlen(family_name);
  __stream = fopen(mapbc_file_name,"r");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",mapbc_file_name);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x462
           ,"ref_inflate_read_usm3d_mapbc","unable to open file");
    faceids_local._4_4_ = 2;
  }
  else {
    do {
      pcVar2 = fgets(family + 0x3f8,0x400,__stream);
      if (pcVar2 == (char *)0x0) {
        fclose(__stream);
        return 0;
      }
      iVar1 = __isoc99_sscanf(family + 0x3f8,"%d %d %d %d %d %s",&bc_family,&i0,&i1,local_848,
                              (long)&len + 4,&bc);
    } while ((((iVar1 != 6) || (iVar1 = strncmp(family_name,(char *)&bc,__n), iVar1 != 0)) ||
             (i0 != boundary_condition)) ||
            (faceids_local._4_4_ = ref_dict_store(faceids,bc_family,-1), faceids_local._4_4_ == 0));
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x468
           ,"ref_inflate_read_usm3d_mapbc",(ulong)faceids_local._4_4_,"store");
  }
  return faceids_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_read_usm3d_mapbc(REF_DICT faceids,
                                                const char *mapbc_file_name,
                                                const char *family_name,
                                                REF_INT boundary_condition) {
  FILE *file;
  char line[1024];
  char family[1024];
  REF_INT faceid, bc, bc_family, i0, i1;
  size_t len;

  len = strlen(family_name);

  file = fopen(mapbc_file_name, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc_file_name);
  RNS(file, "unable to open file");

  while (fgets(line, sizeof(line), file) != NULL) {
    if (6 == sscanf(line, "%d %d %d %d %d %s", &faceid, &bc, &bc_family, &i0,
                    &i1, family)) {
      if (0 == strncmp(family_name, family, len) && bc == boundary_condition) {
        RSS(ref_dict_store(faceids, faceid, REF_EMPTY), "store");
      }
    }
  }

  fclose(file);
  return REF_SUCCESS;
}